

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  uv_cpu_info_t *ci_00;
  FILE *statfile_fp;
  int err;
  uv_cpu_info_t *ci;
  uint *puStack_20;
  uint numcpus;
  int *count_local;
  uv_cpu_info_t **cpu_infos_local;
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  puStack_20 = (uint *)count;
  count_local = (int *)cpu_infos;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    cpu_infos_local._4_4_ = -*piVar2;
  }
  else {
    statfile_fp._4_4_ = uv__cpu_num((FILE *)__stream,(uint *)((long)&ci + 4));
    if (-1 < statfile_fp._4_4_) {
      statfile_fp._4_4_ = -0xc;
      ci_00 = (uv_cpu_info_t *)uv__calloc((ulong)ci._4_4_,0x38);
      if (ci_00 != (uv_cpu_info_t *)0x0) {
        statfile_fp._4_4_ = read_models(ci._4_4_,ci_00);
        if (statfile_fp._4_4_ == 0) {
          statfile_fp._4_4_ = read_times((FILE *)__stream,ci._4_4_,ci_00);
        }
        if (statfile_fp._4_4_ == 0) {
          if (ci_00->speed == 0) {
            read_speeds(ci._4_4_,ci_00);
          }
          *(uv_cpu_info_t **)count_local = ci_00;
          *puStack_20 = ci._4_4_;
          statfile_fp._4_4_ = 0;
        }
        else {
          uv_free_cpu_info(ci_00,ci._4_4_);
        }
      }
    }
    iVar1 = fclose(__stream);
    if (((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 4)) &&
       (piVar2 = __errno_location(), *piVar2 != 0x73)) {
      abort();
    }
    cpu_infos_local._4_4_ = statfile_fp._4_4_;
  }
  return cpu_infos_local._4_4_;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}